

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O0

void Sto_ManMemoryStop(Sto_Man_t *p)

{
  char *pcVar1;
  char *pNext;
  char *pMem;
  Sto_Man_t *p_local;
  
  if (p->pChunkLast != (char *)0x0) {
    pcVar1 = p->pChunkLast;
    while (pNext = pcVar1, pcVar1 = *(char **)pNext, pcVar1 != (char *)0x0) {
      if (pNext != (char *)0x0) {
        free(pNext);
      }
    }
    if (pNext != (char *)0x0) {
      free(pNext);
    }
  }
  return;
}

Assistant:

void Sto_ManMemoryStop( Sto_Man_t * p )
{
    char * pMem, * pNext;
    if ( p->pChunkLast == NULL )
        return;
    for ( pMem = p->pChunkLast; (pNext = *(char **)pMem); pMem = pNext )
        ABC_FREE( pMem );
    ABC_FREE( pMem );
}